

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O1

int Abc_NodeRefDeref(Abc_Obj_t *pNode,int fReference,int fLabel)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  int *piVar3;
  void **ppvVar4;
  Abc_Obj_t *pNode_00;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong extraout_RDX;
  int iVar8;
  
  uVar7 = (ulong)(uint)fLabel;
  iVar8 = 0;
  while( true ) {
    if (fLabel != 0) {
      pAVar2 = pNode->pNtk;
      iVar5 = pAVar2->nTravIds;
      iVar1 = pNode->Id;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,(int)uVar7);
      if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar2->vTravIds).pArray[iVar1] = iVar5;
    }
    uVar6 = *(uint *)&pNode->field_0x14 & 0xf;
    iVar5 = 0;
    if ((uVar6 == 2) || (uVar6 == 5)) break;
    piVar3 = (pNode->vFanins).pArray;
    ppvVar4 = pNode->pNtk->vObjs->pArray;
    uVar7 = (ulong)*piVar3;
    pNode_00 = (Abc_Obj_t *)ppvVar4[uVar7];
    pNode = (Abc_Obj_t *)ppvVar4[piVar3[1]];
    iVar1 = (pNode_00->vFanouts).nSize;
    if (fReference == 0) {
      if (iVar1 < 1) {
        __assert_fail("pNode0->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                      ,0x95,"int Abc_NodeRefDeref(Abc_Obj_t *, int, int)");
      }
      if ((pNode->vFanouts).nSize < 1) {
        __assert_fail("pNode1->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                      ,0x96,"int Abc_NodeRefDeref(Abc_Obj_t *, int, int)");
      }
      iVar5 = 1;
      (pNode_00->vFanouts).nSize = iVar1 + -1;
      if (iVar1 + -1 == 0) {
        iVar5 = Abc_NodeRefDeref(pNode_00,0,fLabel);
        iVar5 = iVar5 + 1;
        uVar7 = extraout_RDX;
      }
      fReference = 0;
      piVar3 = &(pNode->vFanouts).nSize;
      *piVar3 = *piVar3 + -1;
      iVar1 = *piVar3;
    }
    else {
      (pNode_00->vFanouts).nSize = iVar1 + 1;
      fReference = 1;
      iVar5 = 1;
      if (iVar1 == 0) {
        iVar5 = Abc_NodeRefDeref(pNode_00,1,fLabel);
        iVar5 = iVar5 + 1;
      }
      iVar1 = (pNode->vFanouts).nSize;
      uVar7 = (ulong)(iVar1 + 1U);
      (pNode->vFanouts).nSize = iVar1 + 1U;
    }
    if (iVar1 != 0) break;
    iVar8 = iVar8 + iVar5;
  }
  return iVar8 + iVar5;
}

Assistant:

int Abc_NodeRefDeref( Abc_Obj_t * pNode, int fReference, int fLabel )
{
    Abc_Obj_t * pNode0, * pNode1;
    int Counter;
    // label visited nodes
    if ( fLabel )
        Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    // process the internal node
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    Counter = 1;
    if ( fReference )
    {
        if ( pNode0->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDeref( pNode0, fReference, fLabel );
        if ( pNode1->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDeref( pNode1, fReference, fLabel );
    }
    else
    {
        assert( pNode0->vFanouts.nSize > 0 );
        assert( pNode1->vFanouts.nSize > 0 );
        if ( --pNode0->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDeref( pNode0, fReference, fLabel );
        if ( --pNode1->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDeref( pNode1, fReference, fLabel );
    }
    return Counter;
}